

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__check_png_header(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc *psVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar3 = 0;
  do {
    psVar2 = s->img_buffer;
    if (psVar2 < s->img_buffer_end) {
LAB_0011f90e:
      s->img_buffer = psVar2 + 1;
      sVar1 = *psVar2;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar2 = s->img_buffer;
        goto LAB_0011f90e;
      }
      sVar1 = '\0';
    }
    if (sVar1 != stbi__check_png_header::png_sig[lVar3]) {
      *(char **)(in_FS_OFFSET + -0x20) = "bad png sig";
      return 0;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 8) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__check_png_header(stbi__context *s)
{
   static const stbi_uc png_sig[8] = { 137,80,78,71,13,10,26,10 };
   int i;
   for (i=0; i < 8; ++i)
      if (stbi__get8(s) != png_sig[i]) return stbi__err("bad png sig","Not a PNG");
   return 1;
}